

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O1

int ON_ArePointsOnPlane(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                       ON_Plane *plane,double tolerance)

{
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  int iVar1;
  bool bVar2;
  ON_3dPoint *pOVar3;
  char *sFormat;
  int iVar4;
  double *pdVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  ON_3dPoint Q;
  double local_98;
  ON_3dVector local_88;
  ulong local_70;
  ulong local_68;
  undefined4 local_60;
  int local_5c;
  double *local_58;
  ulong local_50;
  ON_3dPoint local_48;
  
  if (0 < count) {
    bVar2 = ON_Plane::IsValid(plane);
    if (bVar2) {
      bVar2 = ON_BoundingBox::IsValid(bbox);
      if (bVar2) {
        bVar2 = ON_IsValid(tolerance);
        if (tolerance < 0.0 || !bVar2) {
          sFormat = "tolerance must be >= 0.0";
          iVar8 = 0x232;
        }
        else if (dim - 4U < 0xfffffffe) {
          sFormat = "dim must be 2 or 3";
          iVar8 = 0x237;
        }
        else {
          uVar7 = (undefined4)CONCAT71(in_register_00000031,is_rat);
          if (stride < (int)((uint)is_rat + dim)) {
            sFormat = "stride parameter is too small";
            iVar8 = 0x23c;
          }
          else if (point == (double *)0x0) {
            sFormat = "point parameter is null";
            iVar8 = 0x241;
          }
          else {
            local_98 = tolerance;
            local_60 = uVar7;
            if ((tolerance == 0.0) && (!NAN(tolerance))) {
              local_98 = ON_BoundingBox::Tolerance(bbox);
            }
            iVar8 = 2;
            local_70 = (ulong)(uint)dim;
            local_5c = count;
            local_58 = point;
            if (count != 1) {
              ON_BoundingBox::Diagonal(&local_88,bbox);
              dVar10 = ON_3dVector::Length(&local_88);
              iVar8 = 2 - (uint)(local_98 < dVar10);
            }
            uVar6 = 0;
            do {
              local_50 = uVar6;
              pOVar3 = ON_BoundingBox::operator[](bbox,(int)uVar6);
              local_88.x = pOVar3->x;
              uVar6 = 0;
              do {
                local_68 = uVar6;
                pOVar3 = ON_BoundingBox::operator[](bbox,(int)uVar6);
                local_88.y = pOVar3->y;
                iVar9 = 0;
                iVar4 = iVar8;
                do {
                  pOVar3 = ON_BoundingBox::operator[](bbox,iVar9);
                  local_88.z = pOVar3->z;
                  p.y = local_88.y;
                  p.x = local_88.x;
                  p.z = local_88.z;
                  ON_Plane::ClosestPointTo(&local_48,plane,p);
                  dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_88,&local_48);
                  iVar1 = local_5c;
                  iVar8 = 0;
                  if (dVar10 <= local_98) {
                    iVar8 = iVar4;
                  }
                } while ((iVar8 != 0) &&
                        (bVar2 = iVar9 == 0, iVar9 = iVar9 + 1, iVar4 = iVar8, bVar2));
              } while ((iVar8 != 0) && (uVar6 = (ulong)((int)local_68 + 1), (int)local_68 == 0));
            } while ((iVar8 != 0) && (uVar6 = (ulong)((int)local_50 + 1), (int)local_50 == 0));
            if (iVar8 != 0) {
              return iVar8;
            }
            local_88.z = ON_3dPoint::Origin.z;
            local_88.x = ON_3dPoint::Origin.x;
            local_88.y = ON_3dPoint::Origin.y;
            iVar8 = 2;
            if (local_5c != 1) {
              ON_BoundingBox::Diagonal((ON_3dVector *)&local_48,bbox);
              dVar10 = ON_3dVector::Length((ON_3dVector *)&local_48);
              iVar8 = 2 - (uint)(local_98 < dVar10);
            }
            if ((char)local_60 == '\0') {
              local_70 = (ulong)(uint)((int)local_70 << 3);
              iVar9 = 1;
              if (1 < iVar1) {
                iVar9 = iVar1;
              }
              pdVar5 = local_58;
              do {
                memcpy((ON_3dPoint *)&local_88,pdVar5,local_70);
                p_01.y = local_88.y;
                p_01.x = local_88.x;
                p_01.z = local_88.z;
                ON_Plane::ClosestPointTo(&local_48,plane,p_01);
                dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_88,&local_48);
                if (local_98 < dVar10) {
                  return 0;
                }
                pdVar5 = pdVar5 + (uint)stride;
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
              return iVar8;
            }
            local_68 = local_70 & 0xffffffff;
            iVar9 = 1;
            if (1 < iVar1) {
              iVar9 = iVar1;
            }
            pdVar5 = local_58;
            while( true ) {
              dVar10 = pdVar5[local_68];
              if ((dVar10 == 0.0) && (!NAN(dVar10))) break;
              ON_ArrayScale((int)local_70,1.0 / dVar10,pdVar5,(double *)&local_88);
              p_00.y = local_88.y;
              p_00.x = local_88.x;
              p_00.z = local_88.z;
              ON_Plane::ClosestPointTo(&local_48,plane,p_00);
              dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_88,&local_48);
              if (local_98 < dVar10) {
                return 0;
              }
              pdVar5 = pdVar5 + (uint)stride;
              iVar9 = iVar9 + -1;
              if (iVar9 == 0) {
                return iVar8;
              }
            }
            sFormat = "rational point has zero weight";
            iVar8 = 0x263;
          }
        }
      }
      else {
        sFormat = "bbox parameter is not valid";
        iVar8 = 0x22d;
      }
    }
    else {
      sFormat = "plane parameter is not valid";
      iVar8 = 0x228;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
               ,iVar8,"",sFormat);
  }
  return 0;
}

Assistant:

int ON_ArePointsOnPlane( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Plane& plane,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;
  if ( !plane.IsValid() )
  {
    ON_ERROR("plane parameter is not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter is not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance must be >= 0.0");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim must be 2 or 3");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter is too small");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter is null");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q;

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}